

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O0

void __thiscall
gss::innards::HomomorphismModel::HomomorphismModel
          (HomomorphismModel *this,InputGraph *target,InputGraph *pattern,HomomorphismParams *params
          ,shared_ptr<gss::innards::Proof> *proof)

{
  string_view s;
  string_view s_00;
  string_view s_01;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  pointer pIVar5;
  undefined8 uVar6;
  reference pvVar7;
  pointer ppVar8;
  size_type sVar9;
  long in_RCX;
  long in_RDI;
  string_view sVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  pVar11;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar12;
  uint g;
  iterator t;
  type_conflict4 *b_3;
  type_conflict4 *__1;
  iterator __end3_1;
  iterator __begin3_1;
  list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range3_1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> cannot_order_yet_1;
  bool loop_detect_1;
  int b_decoded_1;
  int a_decoded_1;
  type *b_2;
  type *a_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2_1;
  list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  target_occur_less_thans_in_wrong_order;
  iterator p;
  type_conflict4 *b_1;
  type_conflict4 *_;
  iterator __end3;
  iterator __begin3;
  list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range3;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> cannot_order_yet;
  bool loop_detect;
  int b_decoded;
  int a_decoded;
  type *b;
  type *a;
  const_iterator __end2;
  const_iterator __begin2;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  pattern_less_thans_in_wrong_order;
  anon_class_1_0_00000001 decode;
  uint i_5;
  uint i_4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  r;
  uint j_1;
  uint i_3;
  int next_edge_label;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  edge_labels_map;
  uint i_2;
  uint i_1;
  int next_vertex_label;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  vertex_labels_map;
  uint j;
  uint i;
  int v_1;
  int v;
  undefined4 in_stack_fffffffffffff508;
  int in_stack_fffffffffffff50c;
  SVOBitset *in_stack_fffffffffffff510;
  const_iterator in_stack_fffffffffffff518;
  Imp *in_stack_fffffffffffff520;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_fffffffffffff528;
  undefined4 in_stack_fffffffffffff530;
  int in_stack_fffffffffffff534;
  InputGraph *in_stack_fffffffffffff538;
  allocator<char> *in_stack_fffffffffffff540;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff548;
  undefined4 in_stack_fffffffffffff550;
  undefined4 in_stack_fffffffffffff554;
  function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_fffffffffffff558;
  InputGraph *in_stack_fffffffffffff560;
  InputGraph *in_stack_fffffffffffff5a8;
  anon_class_1_0_00000001 *in_stack_fffffffffffff5b0;
  undefined7 in_stack_fffffffffffff5b8;
  undefined1 in_stack_fffffffffffff5bf;
  char *in_stack_fffffffffffff5c0;
  uint local_85c;
  undefined1 local_7fd [33];
  undefined4 local_7dc;
  allocator<int> local_7bd;
  undefined4 local_7bc;
  allocator<int> local_79d;
  undefined4 local_79c;
  uint local_780;
  undefined1 local_77a;
  _List_node_base *local_758;
  iterator local_750;
  _List_const_iterator<std::pair<unsigned_int,_unsigned_int>_> local_748;
  _Self local_740;
  _Self local_738;
  _Base_ptr local_730;
  undefined1 local_728;
  type_conflict4 *local_720;
  type_conflict4 *local_718;
  reference local_710;
  _Self local_708;
  _Self local_700;
  list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *local_6f8;
  byte local_6b9;
  __sv_type local_6b8;
  int local_6a4;
  __sv_type local_6a0;
  int local_68c;
  type *local_688;
  type *local_680;
  reference local_678;
  _Self local_670;
  _Self local_668;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_660;
  list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_658;
  undefined1 local_63a;
  _List_node_base *local_618;
  iterator local_610;
  _List_const_iterator<std::pair<unsigned_int,_unsigned_int>_> local_608;
  _Self local_600;
  _Self local_5f8;
  _Base_ptr local_5f0;
  undefined1 local_5e8;
  type_conflict4 *local_5e0;
  type_conflict4 *local_5d8;
  reference local_5d0;
  _Self local_5c8;
  _Self local_5c0;
  list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *local_5b8;
  byte local_579;
  __sv_type local_578;
  int local_564;
  __sv_type local_560;
  int local_54c;
  type *local_548;
  type *local_540;
  reference local_538;
  _Self local_530;
  _Self local_528;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_520;
  list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_518;
  undefined1 *local_4f8;
  int *local_4f0;
  allocator<char> local_4b9;
  string_view local_4b8;
  _Base_ptr local_488;
  uint local_47c;
  _Base_ptr local_478;
  undefined1 local_470;
  string_view local_468;
  _Base_ptr local_458;
  undefined1 local_450;
  uint local_444;
  _Base_ptr local_258;
  undefined1 local_250;
  string_view local_248;
  _Base_ptr local_238;
  undefined1 local_230;
  uint local_224;
  uint local_220;
  int local_21c;
  undefined1 local_218 [55];
  allocator<char> local_1e1;
  string_view local_1e0;
  _Base_ptr local_1b0;
  uint local_1a4;
  _Base_ptr local_1a0;
  undefined1 local_198;
  string_view local_190;
  _Base_ptr local_180;
  undefined1 local_178;
  uint local_170;
  int local_16c;
  uint local_138;
  uint local_134;
  int local_84;
  int local_60;
  undefined1 local_5a;
  long local_20;
  
  local_20 = in_RCX;
  operator_new(0x2e8);
  Imp::Imp(in_stack_fffffffffffff520,(HomomorphismParams *)in_stack_fffffffffffff518._M_node,
           (shared_ptr<gss::innards::Proof> *)in_stack_fffffffffffff510);
  std::
  unique_ptr<gss::innards::HomomorphismModel::Imp,std::default_delete<gss::innards::HomomorphismModel::Imp>>
  ::unique_ptr<std::default_delete<gss::innards::HomomorphismModel::Imp>,void>
            ((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
              *)in_stack_fffffffffffff510,
             (pointer)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
  uVar2 = anon_unknown.dwarf_be555::calculate_n_shape_graphs
                    ((HomomorphismParams *)in_stack_fffffffffffff520);
  *(uint *)(in_RDI + 8) = uVar2;
  iVar3 = InputGraph::size((InputGraph *)0x14be17);
  *(int *)(in_RDI + 0xc) = iVar3;
  iVar3 = InputGraph::size((InputGraph *)0x14be52);
  *(int *)(in_RDI + 0x10) = iVar3;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)0x14be85);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)0x14be9e);
  pIVar5 = std::
           unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         *)0x14beab);
  if ((pIVar5->params->clique_size_constraints & 1U) != 0) {
    pIVar5 = std::
             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           *)0x14bec8);
    if ((pIVar5->params->clique_size_constraints_on_supplementals & 1U) == 0) {
      local_85c = 1;
    }
    else {
      local_85c = *(uint *)(in_RDI + 8);
    }
    pIVar5 = std::
             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           *)0x14bf11);
    pIVar5->max_graphs_for_clique_size_constraints = local_85c;
  }
  std::
  unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                *)0x14bf71);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
           (size_type)in_stack_fffffffffffff528);
  std::
  unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                *)0x14bf9c);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
           (size_type)in_stack_fffffffffffff528);
  if (8 < *(uint *)(in_RDI + 8)) {
    local_5a = 1;
    uVar6 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
               (char *)in_stack_fffffffffffff548,in_stack_fffffffffffff540);
    UnsupportedConfiguration::UnsupportedConfiguration
              ((UnsupportedConfiguration *)in_stack_fffffffffffff510,
               (string *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
    local_5a = 0;
    __cxa_throw(uVar6,&UnsupportedConfiguration::typeinfo,
                UnsupportedConfiguration::~UnsupportedConfiguration);
  }
  pIVar5 = std::
           unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         *)0x14c0e1);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pIVar5->proof);
  if (bVar1) {
    for (local_60 = 0; iVar3 = local_60, iVar4 = InputGraph::size((InputGraph *)0x14c11c),
        iVar3 < iVar4; local_60 = local_60 + 1) {
      std::
      unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    *)0x14c148);
      InputGraph::vertex_name_abi_cxx11_(in_stack_fffffffffffff538,in_stack_fffffffffffff534);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff510,
                  (value_type *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff510);
    }
    for (local_84 = 0; iVar3 = local_84, iVar4 = InputGraph::size((InputGraph *)0x14c1fa),
        iVar3 < iVar4; local_84 = local_84 + 1) {
      std::
      unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    *)0x14c226);
      InputGraph::vertex_name_abi_cxx11_(in_stack_fffffffffffff538,in_stack_fffffffffffff534);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff510,
                  (value_type *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff510);
    }
  }
  bVar1 = InputGraph::directed((InputGraph *)0x14c2c1);
  if (bVar1) {
    pIVar5 = std::
             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           *)0x14c2e4);
    pIVar5->directed = true;
  }
  std::
  unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                *)0x14c2f8);
  SVOBitset::SVOBitset
            ((SVOBitset *)in_stack_fffffffffffff520,
             (uint)((ulong)in_stack_fffffffffffff518._M_node >> 0x20),
             (uint)in_stack_fffffffffffff518._M_node);
  std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::resize
            ((vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
             in_stack_fffffffffffff540,(size_type)in_stack_fffffffffffff538,
             (value_type *)CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530));
  SVOBitset::~SVOBitset(in_stack_fffffffffffff510);
  std::
  unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                *)0x14c36c);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
             (size_type)in_stack_fffffffffffff528);
  for (local_134 = 0; local_134 < *(uint *)(in_RDI + 0xc); local_134 = local_134 + 1) {
    for (local_138 = 0; local_138 < *(uint *)(in_RDI + 0xc); local_138 = local_138 + 1) {
      bVar1 = InputGraph::adjacent
                        ((InputGraph *)in_stack_fffffffffffff520,
                         (int)((ulong)in_stack_fffffffffffff518._M_node >> 0x20),
                         (int)in_stack_fffffffffffff518._M_node);
      if (bVar1) {
        if (local_134 == local_138) {
          pIVar5 = std::
                   unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 *)0x14c421);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&pIVar5->pattern_loops,(ulong)local_134);
          *pvVar7 = 1;
        }
        else {
          pIVar5 = std::
                   unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 *)0x14c474);
          std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                    (&pIVar5->pattern_graph_rows,(ulong)(local_134 * *(int *)(in_RDI + 8)));
          SVOBitset::set((SVOBitset *)CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
                         (int)((ulong)in_stack_fffffffffffff528 >> 0x20));
        }
      }
    }
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)0x14c4e9);
  local_16c = 1;
  bVar1 = InputGraph::has_vertex_labels((InputGraph *)0x14c501);
  if (bVar1) {
    for (local_170 = 0; local_170 < *(uint *)(in_RDI + 0xc); local_170 = local_170 + 1) {
      sVar10 = InputGraph::vertex_label
                         ((InputGraph *)in_stack_fffffffffffff510,in_stack_fffffffffffff50c);
      local_190 = sVar10;
      pVar11 = std::
               map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
               ::emplace<std::basic_string_view<char,std::char_traits<char>>,int&>
                         ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)in_stack_fffffffffffff520,
                          (basic_string_view<char,_std::char_traits<char>_> *)
                          in_stack_fffffffffffff518._M_node,(int *)in_stack_fffffffffffff510);
      local_1a0 = (_Base_ptr)pVar11.first._M_node;
      local_198 = pVar11.second;
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_16c = local_16c + 1;
      }
      local_180 = local_1a0;
      local_178 = local_198;
    }
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x14c648);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
               (size_type)in_stack_fffffffffffff528);
    for (local_1a4 = 0; local_1a4 < *(uint *)(in_RDI + 0xc); local_1a4 = local_1a4 + 1) {
      sVar10 = InputGraph::vertex_label
                         ((InputGraph *)in_stack_fffffffffffff510,in_stack_fffffffffffff50c);
      local_1e0 = sVar10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                 in_stack_fffffffffffff548,in_stack_fffffffffffff540);
      local_1b0 = (_Base_ptr)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                         (key_type *)0x14c718);
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                             *)0x14c73f);
      iVar3 = ppVar8->second;
      pIVar5 = std::
               unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             *)0x14c756);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&pIVar5->pattern_vertex_labels,(ulong)local_1a4);
      *pvVar7 = iVar3;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff510);
      std::allocator<char>::~allocator(&local_1e1);
    }
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)0x14c7ff);
  local_21c = 1;
  bVar1 = InputGraph::has_edge_labels((InputGraph *)0x14c817);
  if (bVar1) {
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x14c83d);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
               (size_type)in_stack_fffffffffffff528);
    for (local_220 = 0; local_220 < *(uint *)(in_RDI + 0xc); local_220 = local_220 + 1) {
      for (local_224 = 0; local_224 < *(uint *)(in_RDI + 0xc); local_224 = local_224 + 1) {
        bVar1 = InputGraph::adjacent
                          ((InputGraph *)in_stack_fffffffffffff520,
                           (int)((ulong)in_stack_fffffffffffff518._M_node >> 0x20),
                           (int)in_stack_fffffffffffff518._M_node);
        if (bVar1) {
          sVar10 = InputGraph::edge_label
                             ((InputGraph *)
                              CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
                              (int)((ulong)in_stack_fffffffffffff528 >> 0x20),
                              (int)in_stack_fffffffffffff528);
          local_248 = sVar10;
          pVar11 = std::
                   map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                   ::emplace<std::basic_string_view<char,std::char_traits<char>>,int&>
                             ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)in_stack_fffffffffffff520,
                              (basic_string_view<char,_std::char_traits<char>_> *)
                              in_stack_fffffffffffff518._M_node,(int *)in_stack_fffffffffffff510);
          local_258 = (_Base_ptr)pVar11.first._M_node;
          local_250 = pVar11.second;
          if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_21c = local_21c + 1;
          }
          local_238 = local_258;
          local_230 = local_250;
          ppVar8 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                 *)0x14c9d2);
          iVar3 = ppVar8->second;
          pIVar5 = std::
                   unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 *)0x14c9e9);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&pIVar5->pattern_edge_labels,
                              (ulong)(local_220 * *(int *)(in_RDI + 0xc) + local_224));
          *pvVar7 = iVar3;
        }
      }
    }
  }
  std::
  unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                *)0x14ca5e);
  SVOBitset::SVOBitset
            ((SVOBitset *)in_stack_fffffffffffff520,
             (uint)((ulong)in_stack_fffffffffffff518._M_node >> 0x20),
             (uint)in_stack_fffffffffffff518._M_node);
  std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::resize
            ((vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
             in_stack_fffffffffffff540,(size_type)in_stack_fffffffffffff538,
             (value_type *)CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530));
  SVOBitset::~SVOBitset(in_stack_fffffffffffff510);
  std::
  unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                *)0x14cad2);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
             (size_type)in_stack_fffffffffffff528);
  std::function<void(int,int,std::basic_string_view<char,std::char_traits<char>>)>::
  function<gss::innards::HomomorphismModel::HomomorphismModel(InputGraph_const&,InputGraph_const&,gss::HomomorphismParams_const&,std::shared_ptr<gss::innards::Proof>const&)::__0,void>
            ((function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)> *)
             in_stack_fffffffffffff520,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffff518._M_node)
  ;
  InputGraph::for_each_edge(in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  std::function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>::~function
            ((function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)> *)
             0x14cb51);
  bVar1 = InputGraph::directed((InputGraph *)0x14cb5e);
  if (bVar1) {
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x14cb84);
    SVOBitset::SVOBitset
              ((SVOBitset *)in_stack_fffffffffffff520,
               (uint)((ulong)in_stack_fffffffffffff518._M_node >> 0x20),
               (uint)in_stack_fffffffffffff518._M_node);
    std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::resize
              ((vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
               in_stack_fffffffffffff540,(size_type)in_stack_fffffffffffff538,
               (value_type *)CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530));
    SVOBitset::~SVOBitset(in_stack_fffffffffffff510);
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x14cbf2);
    SVOBitset::SVOBitset
              ((SVOBitset *)in_stack_fffffffffffff520,
               (uint)((ulong)in_stack_fffffffffffff518._M_node >> 0x20),
               (uint)in_stack_fffffffffffff518._M_node);
    std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::resize
              ((vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
               in_stack_fffffffffffff540,(size_type)in_stack_fffffffffffff538,
               (value_type *)CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530));
    SVOBitset::~SVOBitset(in_stack_fffffffffffff510);
    std::function<void(int,int,std::basic_string_view<char,std::char_traits<char>>)>::
    function<gss::innards::HomomorphismModel::HomomorphismModel(InputGraph_const&,InputGraph_const&,gss::HomomorphismParams_const&,std::shared_ptr<gss::innards::Proof>const&)::__1,void>
              ((function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)> *)
               in_stack_fffffffffffff520,
               (anon_class_8_1_8991fb9c *)in_stack_fffffffffffff518._M_node);
    InputGraph::for_each_edge(in_stack_fffffffffffff560,in_stack_fffffffffffff558);
    std::function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>::~function
              ((function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)> *)
               0x14ccb4);
  }
  bVar1 = InputGraph::has_vertex_labels((InputGraph *)0x14cd84);
  if (bVar1) {
    for (local_444 = 0; local_444 < *(uint *)(in_RDI + 0x10); local_444 = local_444 + 1) {
      sVar10 = InputGraph::vertex_label
                         ((InputGraph *)in_stack_fffffffffffff510,in_stack_fffffffffffff50c);
      local_468 = sVar10;
      pVar11 = std::
               map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
               ::emplace<std::basic_string_view<char,std::char_traits<char>>,int&>
                         ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)in_stack_fffffffffffff520,
                          (basic_string_view<char,_std::char_traits<char>_> *)
                          in_stack_fffffffffffff518._M_node,(int *)in_stack_fffffffffffff510);
      local_478 = (_Base_ptr)pVar11.first._M_node;
      local_470 = pVar11.second;
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_16c = local_16c + 1;
      }
      local_458 = local_478;
      local_450 = local_470;
    }
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x14ceb0);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
               (size_type)in_stack_fffffffffffff528);
    for (local_47c = 0; local_47c < *(uint *)(in_RDI + 0x10); local_47c = local_47c + 1) {
      sVar10 = InputGraph::vertex_label
                         ((InputGraph *)in_stack_fffffffffffff510,in_stack_fffffffffffff50c);
      local_4b8 = sVar10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                 in_stack_fffffffffffff548,in_stack_fffffffffffff540);
      local_488 = (_Base_ptr)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                         (key_type *)0x14cf80);
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                             *)0x14cfa7);
      iVar3 = ppVar8->second;
      pIVar5 = std::
               unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             *)0x14cfbe);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&pIVar5->target_vertex_labels,(ulong)local_47c);
      *pvVar7 = iVar3;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff510);
      std::allocator<char>::~allocator(&local_4b9);
    }
  }
  bVar1 = InputGraph::has_edge_labels((InputGraph *)0x14d067);
  if (bVar1) {
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x14d08d);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
               (size_type)in_stack_fffffffffffff528);
    local_4f8 = local_218;
    local_4f0 = &local_21c;
    std::function<void(int,int,std::basic_string_view<char,std::char_traits<char>>)>::
    function<gss::innards::HomomorphismModel::HomomorphismModel(InputGraph_const&,InputGraph_const&,gss::HomomorphismParams_const&,std::shared_ptr<gss::innards::Proof>const&)::__2,void>
              ((function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)> *)
               in_stack_fffffffffffff520,
               (anon_class_24_3_8c704a55 *)in_stack_fffffffffffff518._M_node);
    InputGraph::for_each_edge(in_stack_fffffffffffff560,in_stack_fffffffffffff558);
    std::function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>::~function
              ((function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)> *)
               0x14d129);
  }
  pIVar5 = std::
           unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         *)0x14d15e);
  bVar1 = std::__cxx11::
          list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&pIVar5->params->pattern_less_constraints);
  if (!bVar1) {
    pIVar5 = std::
             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           *)0x14d182);
    pIVar5->has_less_thans = true;
    std::__cxx11::
    list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::list((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)0x14d196);
    pIVar5 = std::
             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           *)0x14d1a3);
    local_520 = &pIVar5->params->pattern_less_constraints;
    local_528._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
    local_530._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
    while( true ) {
      bVar1 = std::operator==(&local_528,&local_530);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_538 = std::
                  _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator*((_List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffff510);
      local_540 = std::get<0ul,std::__cxx11::string,std::__cxx11::string>
                            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)0x14d220);
      local_548 = std::get<1ul,std::__cxx11::string,std::__cxx11::string>
                            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)0x14d235);
      local_560 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff510);
      sVar10._M_len._7_1_ = in_stack_fffffffffffff5bf;
      sVar10._M_len._0_7_ = in_stack_fffffffffffff5b8;
      sVar10._M_str = in_stack_fffffffffffff5c0;
      local_54c = HomomorphismModel::anon_class_1_0_00000001::operator()
                            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,sVar10);
      local_578 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff510);
      s._M_len._7_1_ = in_stack_fffffffffffff5bf;
      s._M_len._0_7_ = in_stack_fffffffffffff5b8;
      s._M_str = in_stack_fffffffffffff5c0;
      local_564 = HomomorphismModel::anon_class_1_0_00000001::operator()
                            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,s);
      std::__cxx11::
      list<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
      ::emplace_back<int&,int&>
                ((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  *)in_stack_fffffffffffff520,(int *)in_stack_fffffffffffff518._M_node,
                 (int *)in_stack_fffffffffffff510);
      std::
      _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&local_528);
    }
    while( true ) {
      bVar1 = std::__cxx11::
              list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ::empty(&local_518);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_579 = 1;
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 0x14d38a);
      local_5b8 = &local_518;
      local_5c0._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::begin((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      local_5c8._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::end((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      while( true ) {
        bVar1 = std::operator==(&local_5c0,&local_5c8);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        local_5d0 = std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator*
                              ((_List_iterator<std::pair<unsigned_int,_unsigned_int>_> *)0x14d3f1);
        local_5d8 = std::get<0ul,unsigned_int,unsigned_int>
                              ((pair<unsigned_int,_unsigned_int> *)0x14d406);
        local_5e0 = std::get<1ul,unsigned_int,unsigned_int>
                              ((pair<unsigned_int,_unsigned_int> *)0x14d41b);
        pVar12 = std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
                 emplace<unsigned_int&>
                           ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
                            (uint *)in_stack_fffffffffffff528);
        local_5f0 = (_Base_ptr)pVar12.first._M_node;
        local_5e8 = pVar12.second;
        std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator++(&local_5c0);
      }
      local_5f8._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::begin((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      while( true ) {
        local_600._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ::end((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
        bVar1 = std::operator==(&local_5f8,&local_600);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator->
                  ((_List_iterator<std::pair<unsigned_int,_unsigned_int>_> *)0x14d4e9);
        sVar9 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      in_stack_fffffffffffff520,
                      (key_type_conflict *)in_stack_fffffffffffff518._M_node);
        if (sVar9 == 0) {
          local_579 = 0;
          std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator*
                    ((_List_iterator<std::pair<unsigned_int,_unsigned_int>_> *)0x14d54c);
          std::
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ::push_back((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)in_stack_fffffffffffff520,(value_type *)in_stack_fffffffffffff518._M_node);
          local_610._M_node =
               (_List_node_base *)
               std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator++(&local_5f8,0)
          ;
          std::_List_const_iterator<std::pair<unsigned_int,_unsigned_int>_>::_List_const_iterator
                    (&local_608,&local_610);
          local_618 = (_List_node_base *)
                      std::__cxx11::
                      list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      ::erase((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                               *)in_stack_fffffffffffff510,in_stack_fffffffffffff518);
        }
        else {
          std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator++(&local_5f8);
        }
      }
      if ((local_579 & 1) != 0) {
        local_63a = 1;
        uVar6 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                   (char *)in_stack_fffffffffffff548,in_stack_fffffffffffff540);
        UnsupportedConfiguration::UnsupportedConfiguration
                  ((UnsupportedConfiguration *)in_stack_fffffffffffff510,
                   (string *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
        local_63a = 0;
        __cxa_throw(uVar6,&UnsupportedConfiguration::typeinfo,
                    UnsupportedConfiguration::~UnsupportedConfiguration);
      }
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 0x14d6b0);
    }
    std::__cxx11::
    list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::~list((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)0x14d6d1);
  }
  pIVar5 = std::
           unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         *)0x14d6f2);
  bVar1 = std::__cxx11::
          list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&pIVar5->params->target_occur_less_constraints);
  if (!bVar1) {
    pIVar5 = std::
             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           *)0x14d716);
    pIVar5->has_occur_less_thans = true;
    std::__cxx11::
    list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::list((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)0x14d72a);
    pIVar5 = std::
             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           *)0x14d737);
    local_660 = &pIVar5->params->target_occur_less_constraints;
    local_668._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
    local_670._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
    while( true ) {
      bVar1 = std::operator==(&local_668,&local_670);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_678 = std::
                  _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator*((_List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffff510);
      local_680 = std::get<0ul,std::__cxx11::string,std::__cxx11::string>
                            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)0x14d7b4);
      local_688 = std::get<1ul,std::__cxx11::string,std::__cxx11::string>
                            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)0x14d7c9);
      local_6a0 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff510);
      s_00._M_len._7_1_ = in_stack_fffffffffffff5bf;
      s_00._M_len._0_7_ = in_stack_fffffffffffff5b8;
      s_00._M_str = in_stack_fffffffffffff5c0;
      local_68c = HomomorphismModel::anon_class_1_0_00000001::operator()
                            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,s_00);
      local_6b8 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff510);
      s_01._M_len._7_1_ = in_stack_fffffffffffff5bf;
      s_01._M_len._0_7_ = in_stack_fffffffffffff5b8;
      s_01._M_str = in_stack_fffffffffffff5c0;
      local_6a4 = HomomorphismModel::anon_class_1_0_00000001::operator()
                            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,s_01);
      std::__cxx11::
      list<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
      ::emplace_back<int&,int&>
                ((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  *)in_stack_fffffffffffff520,(int *)in_stack_fffffffffffff518._M_node,
                 (int *)in_stack_fffffffffffff510);
      std::
      _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&local_668);
    }
    while( true ) {
      bVar1 = std::__cxx11::
              list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ::empty(&local_658);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_6b9 = 1;
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 0x14d91e);
      local_6f8 = &local_658;
      local_700._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::begin((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      local_708._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::end((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      while( true ) {
        bVar1 = std::operator==(&local_700,&local_708);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        local_710 = std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator*
                              ((_List_iterator<std::pair<unsigned_int,_unsigned_int>_> *)0x14d985);
        local_718 = std::get<0ul,unsigned_int,unsigned_int>
                              ((pair<unsigned_int,_unsigned_int> *)0x14d99a);
        local_720 = std::get<1ul,unsigned_int,unsigned_int>
                              ((pair<unsigned_int,_unsigned_int> *)0x14d9af);
        pVar12 = std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
                 emplace<unsigned_int&>
                           ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
                            (uint *)in_stack_fffffffffffff528);
        local_730 = (_Base_ptr)pVar12.first._M_node;
        local_728 = pVar12.second;
        std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator++(&local_700);
      }
      local_738._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::begin((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      while( true ) {
        local_740._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ::end((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
        bVar1 = std::operator==(&local_738,&local_740);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator->
                  ((_List_iterator<std::pair<unsigned_int,_unsigned_int>_> *)0x14da7d);
        sVar9 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      in_stack_fffffffffffff520,
                      (key_type_conflict *)in_stack_fffffffffffff518._M_node);
        if (sVar9 == 0) {
          local_6b9 = 0;
          std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator*
                    ((_List_iterator<std::pair<unsigned_int,_unsigned_int>_> *)0x14dae0);
          std::
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ::push_back((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)in_stack_fffffffffffff520,(value_type *)in_stack_fffffffffffff518._M_node);
          local_750._M_node =
               (_List_node_base *)
               std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator++(&local_738,0)
          ;
          std::_List_const_iterator<std::pair<unsigned_int,_unsigned_int>_>::_List_const_iterator
                    (&local_748,&local_750);
          local_758 = (_List_node_base *)
                      std::__cxx11::
                      list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      ::erase((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                               *)in_stack_fffffffffffff510,in_stack_fffffffffffff518);
        }
        else {
          std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator++(&local_738);
        }
      }
      if ((local_6b9 & 1) != 0) {
        local_77a = 1;
        uVar6 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                   (char *)in_stack_fffffffffffff548,in_stack_fffffffffffff540);
        UnsupportedConfiguration::UnsupportedConfiguration
                  ((UnsupportedConfiguration *)in_stack_fffffffffffff510,
                   (string *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
        local_77a = 0;
        __cxa_throw(uVar6,&UnsupportedConfiguration::typeinfo,
                    UnsupportedConfiguration::~UnsupportedConfiguration);
      }
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 0x14dc44);
    }
    std::__cxx11::
    list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::~list((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)0x14dc65);
  }
  if ((*(byte *)(local_20 + 0x88) & 1) != 0) {
    local_780 = 0;
    while( true ) {
      uVar2 = local_780;
      pIVar5 = std::
               unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             *)0x14dcb4);
      if (pIVar5->max_graphs_for_clique_size_constraints <= uVar2) break;
      std::
      unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    *)0x14dcd7);
      InputGraph::size((InputGraph *)0x14dcf2);
      local_79c = 0;
      std::allocator<int>::allocator((allocator<int> *)0x14dd26);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
                 (size_type)in_stack_fffffffffffff528,
                 (value_type_conflict1 *)in_stack_fffffffffffff520,
                 (allocator_type *)in_stack_fffffffffffff518._M_node);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)in_stack_fffffffffffff510,
                  (value_type *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff520);
      std::allocator<int>::~allocator(&local_79d);
      std::
      unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    *)0x14dd85);
      InputGraph::size((InputGraph *)0x14dd9d);
      local_7bc = 0;
      std::allocator<int>::allocator((allocator<int> *)0x14ddcb);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
                 (size_type)in_stack_fffffffffffff528,
                 (value_type_conflict1 *)in_stack_fffffffffffff520,
                 (allocator_type *)in_stack_fffffffffffff518._M_node);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)in_stack_fffffffffffff510,
                  (value_type *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff520);
      std::allocator<int>::~allocator(&local_7bd);
      std::
      unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    *)0x14de27);
      InputGraph::size((InputGraph *)0x14de3f);
      local_7dc = 0;
      std::allocator<int>::allocator((allocator<int> *)0x14de6d);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
                 (size_type)in_stack_fffffffffffff528,
                 (value_type_conflict1 *)in_stack_fffffffffffff520,
                 (allocator_type *)in_stack_fffffffffffff518._M_node);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)in_stack_fffffffffffff510,
                  (value_type *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff520);
      std::allocator<int>::~allocator((allocator<int> *)(local_7fd + 0x20));
      pIVar5 = std::
               unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             *)0x14dec9);
      in_stack_fffffffffffff528 = &pIVar5->target_cliques_best_knowns;
      in_stack_fffffffffffff534 = InputGraph::size((InputGraph *)0x14dee1);
      in_stack_fffffffffffff518._M_node = (_List_node_base *)(long)in_stack_fffffffffffff534;
      local_7fd._1_4_ = 0;
      in_stack_fffffffffffff520 = (Imp *)local_7fd;
      std::allocator<int>::allocator((allocator<int> *)0x14df0f);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
                 (size_type)in_stack_fffffffffffff528,
                 (value_type_conflict1 *)in_stack_fffffffffffff520,
                 (allocator_type *)in_stack_fffffffffffff518._M_node);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)in_stack_fffffffffffff510,
                  (value_type *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff520);
      std::allocator<int>::~allocator((allocator<int> *)local_7fd);
      local_780 = local_780 + 1;
    }
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x14e0a2);
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x14e0ba);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
               (size_type)in_stack_fffffffffffff528);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)0x14e0dd);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)0x14e0ea);
  return;
}

Assistant:

HomomorphismModel::HomomorphismModel(const InputGraph & target, const InputGraph & pattern, const HomomorphismParams & params,
    const std::shared_ptr<Proof> & proof) :
    _imp(new Imp(params, proof)),
    max_graphs(calculate_n_shape_graphs(params)),
    pattern_size(pattern.size()),
    target_size(target.size())
{
    if (_imp->params.clique_size_constraints)
        _imp->max_graphs_for_clique_size_constraints = (_imp->params.clique_size_constraints_on_supplementals ? max_graphs : 1);

    _imp->patterns_degrees.resize(max_graphs);
    _imp->targets_degrees.resize(max_graphs);

    if (max_graphs > 8 * sizeof(PatternAdjacencyBitsType))
        throw UnsupportedConfiguration{"Supplemental graphs won't fit in the chosen bitset size"};

    if (_imp->proof) {
        for (int v = 0; v < pattern.size(); ++v)
            _imp->pattern_vertex_proof_names.push_back(pattern.vertex_name(v));
        for (int v = 0; v < target.size(); ++v)
            _imp->target_vertex_proof_names.push_back(target.vertex_name(v));
    }

    if (pattern.directed())
        _imp->directed = true;

    // recode pattern to a bit graph, and strip out loops
    _imp->pattern_graph_rows.resize(pattern_size * max_graphs, SVOBitset(pattern_size, 0));
    _imp->pattern_loops.resize(pattern_size);
    for (unsigned i = 0; i < pattern_size; ++i) {
        for (unsigned j = 0; j < pattern_size; ++j) {
            if (pattern.adjacent(i, j)) {
                if (i == j)
                    _imp->pattern_loops[i] = 1;
                else
                    _imp->pattern_graph_rows[i * max_graphs + 0].set(j);
            }
        }
    }

    // re-encode and store pattern labels
    map<string, int> vertex_labels_map;
    int next_vertex_label = 1;
    if (pattern.has_vertex_labels()) {
        for (unsigned i = 0; i < pattern_size; ++i) {
            if (vertex_labels_map.emplace(pattern.vertex_label(i), next_vertex_label).second)
                ++next_vertex_label;
        }

        _imp->pattern_vertex_labels.resize(pattern_size);
        for (unsigned i = 0; i < pattern_size; ++i)
            _imp->pattern_vertex_labels[i] = vertex_labels_map.find(string{pattern.vertex_label(i)})->second;
    }

    // re-encode and store edge labels
    map<string, int> edge_labels_map;
    int next_edge_label = 1;
    if (pattern.has_edge_labels()) {
        _imp->pattern_edge_labels.resize(pattern_size * pattern_size);
        for (unsigned i = 0; i < pattern_size; ++i)
            for (unsigned j = 0; j < pattern_size; ++j)
                if (pattern.adjacent(i, j)) {
                    auto r = edge_labels_map.emplace(pattern.edge_label(i, j), next_edge_label);
                    if (r.second)
                        ++next_edge_label;
                    _imp->pattern_edge_labels[i * pattern_size + j] = r.first->second;
                }
    }

    // recode target to a bit graph, and take out loops
    _imp->target_graph_rows.resize(target_size * max_graphs, SVOBitset{target_size, 0});
    _imp->target_loops.resize(target_size);
    target.for_each_edge([&](int f, int t, string_view) {
        if (f == t)
            _imp->target_loops[f] = 1;
        else
            _imp->target_graph_rows[f * max_graphs + 0].set(t);
    });

    // if directed, do both directions
    if (pattern.directed()) {
        _imp->forward_target_graph_rows.resize(target_size, SVOBitset{target_size, 0});
        _imp->reverse_target_graph_rows.resize(target_size, SVOBitset{target_size, 0});
        target.for_each_edge([&](int f, int t, string_view l) {
            if (f != t && l != "unlabelled") {
                _imp->forward_target_graph_rows[f].set(t);
                _imp->reverse_target_graph_rows[t].set(f);
            }
        });
    }

    // target vertex labels
    if (pattern.has_vertex_labels()) {
        for (unsigned i = 0; i < target_size; ++i) {
            if (vertex_labels_map.emplace(target.vertex_label(i), next_vertex_label).second)
                ++next_vertex_label;
        }

        _imp->target_vertex_labels.resize(target_size);
        for (unsigned i = 0; i < target_size; ++i)
            _imp->target_vertex_labels[i] = vertex_labels_map.find(string{target.vertex_label(i)})->second;
    }

    // target edge labels
    if (pattern.has_edge_labels()) {
        _imp->target_edge_labels.resize(target_size * target_size);
        target.for_each_edge([&](int f, int t, string_view l) {
            auto r = edge_labels_map.emplace(l, next_edge_label);
            if (r.second)
                ++next_edge_label;

            _imp->target_edge_labels[f * target_size + t] = r.first->second;
        });
    }

    auto decode = [&](const InputGraph & g, string_view s) -> int {
        auto n = g.vertex_from_name(s);
        if (! n)
            throw UnsupportedConfiguration{"No vertex named '" + string{s} + "'"};
        return *n;
    };

    // pattern less than constraints
    if (! _imp->params.pattern_less_constraints.empty()) {
        _imp->has_less_thans = true;
        list<pair<unsigned, unsigned>> pattern_less_thans_in_wrong_order;
        for (auto & [a, b] : _imp->params.pattern_less_constraints) {
            auto a_decoded = decode(pattern, a), b_decoded = decode(pattern, b);
            pattern_less_thans_in_wrong_order.emplace_back(a_decoded, b_decoded);
        }

        // put them in a convenient order, so we don't need a propagation loop
        while (! pattern_less_thans_in_wrong_order.empty()) {
            bool loop_detect = true;
            set<unsigned> cannot_order_yet;
            for (auto & [_, b] : pattern_less_thans_in_wrong_order)
                cannot_order_yet.emplace(b);
            for (auto p = pattern_less_thans_in_wrong_order.begin(); p != pattern_less_thans_in_wrong_order.end();) {
                if (cannot_order_yet.count(p->first))
                    ++p;
                else {
                    loop_detect = false;
                    pattern_less_thans_in_convenient_order.push_back(*p);
                    pattern_less_thans_in_wrong_order.erase(p++);
                }
            }

            if (loop_detect)
                throw UnsupportedConfiguration{"Pattern less than constraints form a loop"};
        }
    }

    // target less than constraints
    if (! _imp->params.target_occur_less_constraints.empty()) {
        _imp->has_occur_less_thans = true;
        list<pair<unsigned, unsigned>> target_occur_less_thans_in_wrong_order;
        for (auto & [a, b] : _imp->params.target_occur_less_constraints) {
            auto a_decoded = decode(target, a), b_decoded = decode(target, b);
            target_occur_less_thans_in_wrong_order.emplace_back(a_decoded, b_decoded);
        }

        // put them in a convenient order, so we don't need a propagation loop
        while (! target_occur_less_thans_in_wrong_order.empty()) {
            bool loop_detect = true;
            set<unsigned> cannot_order_yet;
            for (auto & [_, b] : target_occur_less_thans_in_wrong_order)
                cannot_order_yet.emplace(b);
            for (auto t = target_occur_less_thans_in_wrong_order.begin(); t != target_occur_less_thans_in_wrong_order.end();) {
                if (cannot_order_yet.count(t->first))
                    ++t;
                else {
                    loop_detect = false;
                    target_occur_less_thans_in_convenient_order.push_back(*t);
                    target_occur_less_thans_in_wrong_order.erase(t++);
                }
            }

            if (loop_detect)
                throw UnsupportedConfiguration{"Target less than constraints form a loop"};
        }
    }

    // make space for clique constraints
    if (params.clique_size_constraints) {
        for (unsigned g = 0; g < _imp->max_graphs_for_clique_size_constraints; ++g) {
            _imp->pattern_cliques_sizes.push_back(vector<int>(pattern.size(), 0));
            _imp->target_cliques_sizes.push_back(vector<int>(target.size(), 0));
            _imp->pattern_cliques_best_knowns.push_back(vector<int>(pattern.size(), 0));
            _imp->target_cliques_best_knowns.push_back(vector<int>(target.size(), 0));
        }
        _imp->largest_pattern_clique.resize(_imp->max_graphs_for_clique_size_constraints);
    }
}